

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::resetGLStates(RenderTarget *this)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t __len;
  sockaddr *__addr;
  RenderTarget *in_RDI;
  RenderTarget *unaff_retaddr;
  bool vertexBufferAvailable;
  Uint64 in_stack_00000008;
  bool shaderAvailable;
  BlendMode *in_stack_00000028;
  RenderTarget *in_stack_00000030;
  undefined6 in_stack_fffffffffffffff0;
  RenderTarget *texture;
  
  texture = in_RDI;
  bVar1 = Shader::isAvailable();
  bVar2 = VertexBuffer::isAvailable();
  bVar3 = anon_unknown.dwarf_1aa64e::RenderTargetImpl::isActive(in_stack_00000008);
  if ((bVar3) || (uVar4 = (*in_RDI->_vptr_RenderTarget[4])(in_RDI,1), (uVar4 & 1) != 0)) {
    priv::ensureExtensionsInit();
    if (SF_GLAD_GL_ARB_multitexture != 0) {
      (*sf_glad_glClientActiveTextureARB)(0x84c0);
      (*sf_glad_glActiveTextureARB)(0x84c0);
    }
    (*sf_glad_glDisable)(0xb44);
    (*sf_glad_glDisable)(0xb50);
    (*sf_glad_glDisable)(0xb71);
    (*sf_glad_glDisable)(0xbc0);
    (*sf_glad_glEnable)(0xde1);
    (*sf_glad_glEnable)(0xbe2);
    (*sf_glad_glMatrixMode)(0x1700);
    (*sf_glad_glLoadIdentity)();
    (*sf_glad_glEnableClientState)(0x8074);
    (*sf_glad_glEnableClientState)(0x8076);
    (*sf_glad_glEnableClientState)(0x8078);
    (in_RDI->m_cache).glStatesSet = true;
    applyBlendMode(in_stack_00000030,in_stack_00000028);
    __addr = (sockaddr *)0x0;
    applyTexture(unaff_retaddr,(Texture *)texture);
    __len = extraout_EDX;
    if ((bVar1 & 1) != 0) {
      __addr = (sockaddr *)0x0;
      applyShader((RenderTarget *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_fffffffffffffff0)),
                  (Shader *)in_RDI);
      __len = extraout_EDX_00;
    }
    if ((bVar2 & 1) != 0) {
      VertexBuffer::bind(0,__addr,__len);
    }
    (in_RDI->m_cache).texCoordsArrayEnabled = true;
    (in_RDI->m_cache).useVertexCache = false;
    getView(in_RDI);
    setView((RenderTarget *)CONCAT17(bVar1,CONCAT16(bVar2,in_stack_fffffffffffffff0)),(View *)in_RDI
           );
    (in_RDI->m_cache).enable = true;
  }
  return;
}

Assistant:

void RenderTarget::resetGLStates()
{
    // Check here to make sure a context change does not happen after activate(true)
    bool shaderAvailable = Shader::isAvailable();
    bool vertexBufferAvailable = VertexBuffer::isAvailable();

    // Workaround for states not being properly reset on
    // macOS unless a context switch really takes place
    #if defined(SFML_SYSTEM_MACOS)
        setActive(false);
    #endif

    if (RenderTargetImpl::isActive(m_id) || setActive(true))
    {
        // Make sure that extensions are initialized
        priv::ensureExtensionsInit();

        // Make sure that the texture unit which is active is the number 0
        if (GLEXT_multitexture)
        {
            glCheck(GLEXT_glClientActiveTexture(GLEXT_GL_TEXTURE0));
            glCheck(GLEXT_glActiveTexture(GLEXT_GL_TEXTURE0));
        }

        // Define the default OpenGL states
        glCheck(glDisable(GL_CULL_FACE));
        glCheck(glDisable(GL_LIGHTING));
        glCheck(glDisable(GL_DEPTH_TEST));
        glCheck(glDisable(GL_ALPHA_TEST));
        glCheck(glEnable(GL_TEXTURE_2D));
        glCheck(glEnable(GL_BLEND));
        glCheck(glMatrixMode(GL_MODELVIEW));
        glCheck(glLoadIdentity());
        glCheck(glEnableClientState(GL_VERTEX_ARRAY));
        glCheck(glEnableClientState(GL_COLOR_ARRAY));
        glCheck(glEnableClientState(GL_TEXTURE_COORD_ARRAY));
        m_cache.glStatesSet = true;

        // Apply the default SFML states
        applyBlendMode(BlendAlpha);
        applyTexture(NULL);
        if (shaderAvailable)
            applyShader(NULL);

        if (vertexBufferAvailable)
            glCheck(VertexBuffer::bind(NULL));

        m_cache.texCoordsArrayEnabled = true;

        m_cache.useVertexCache = false;

        // Set the default view
        setView(getView());

        m_cache.enable = true;
    }
}